

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::MemPass::RemovePhiOperands
          (MemPass *this,Instruction *phi,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *reachable_blocks)

{
  IRContext *pIVar1;
  CFG *this_00;
  uint32_t uVar2;
  ulong uVar3;
  const_iterator cVar4;
  Instruction *instr;
  pointer pOVar5;
  uint index;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> keep_operands;
  BasicBlock *def_block;
  BasicBlock *in_block;
  _Type local_c4;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b8;
  undefined1 local_98 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  undefined1 local_70 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_48;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar5 = (phi->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(phi->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
          -0x5555555555555555;
  if ((int)uVar3 != 0) {
    local_c4[0] = '\0';
    local_c4[1] = '\0';
    local_c4[2] = '\0';
    local_c4[3] = '\0';
    uVar7 = 0;
    do {
      uVar6 = 2;
      if (2 < (uint)uVar7) {
        uVar6 = uVar7;
      }
      if ((uint)uVar7 < 2) {
        lVar8 = uVar7 * 0x30;
        do {
          if (uVar3 <= uVar7) goto LAB_005f24d4;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_b8,
                     (value_type *)((long)((pOVar5->words).buffer + 0xfffffffffffffffa) + lVar8));
          uVar7 = uVar7 + 1;
          pOVar5 = (phi->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = ((long)(phi->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                  -0x5555555555555555;
          if ((uVar3 & 0xffffffff) <= uVar7) goto LAB_005f248d;
          lVar8 = lVar8 + 0x30;
        } while (uVar6 != uVar7);
      }
      index = (uint)uVar6;
      if ((int)uVar3 - 1U <= index) {
        __assert_fail("i % 2 == 0 && i < phi->NumOperands() - 1 && \"malformed Phi arguments\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp"
                      ,0x163,
                      "void spvtools::opt::MemPass::RemovePhiOperands(Instruction *, const std::unordered_set<BasicBlock *> &)"
                     );
      }
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      this_00 = (pIVar1->cfg_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
                _M_t.
                super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
      uVar2 = Instruction::GetSingleWordOperand(phi,index | 1);
      local_38 = CFG::block(this_00,uVar2);
      cVar4 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&reachable_blocks->_M_h,&local_38);
      if (cVar4.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur !=
          (__node_type *)0x0) {
        uVar2 = Instruction::GetSingleWordOperand(phi,index);
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        instr = analysis::DefUseManager::GetDef
                          ((pIVar1->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,uVar2);
        local_40 = IRContext::get_instr_block((this->super_Pass).context_,instr);
        if ((local_40 == (BasicBlock *)0x0) ||
           (cVar4 = std::
                    _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&reachable_blocks->_M_h,&local_40),
           cVar4.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur !=
           (__node_type *)0x0)) {
          pOVar5 = (phi->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = ((long)(phi->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                  -0x5555555555555555;
          if (uVar3 < uVar6 || uVar3 - uVar6 == 0) goto LAB_005f24d4;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_b8,pOVar5 + uVar6);
        }
        else {
          if (local_c4 == (_Type)0x0) {
            uVar2 = 0;
            if (instr->has_type_id_ == true) {
              uVar2 = Instruction::GetSingleWordOperand(instr,0);
            }
            local_c4 = (_Type)Type2Undef(this,uVar2);
          }
          local_98._0_8_ = &PTR__SmallVector_00930a20;
          local_98._24_8_ = local_98 + 0x10;
          local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_98._8_8_ = 1;
          local_70._0_4_ = SPV_OPERAND_TYPE_ID;
          local_70._8_8_ = &PTR__SmallVector_00930a20;
          local_70._16_8_ = 0;
          local_70._32_8_ = local_70 + 0x18;
          local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_98._16_4_ = local_c4;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_70 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_98);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_b8,(Operand *)local_70);
          local_70._8_8_ = &PTR__SmallVector_00930a20;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_48._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_48,local_48._M_head_impl);
          }
          local_48._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_98._0_8_ = &PTR__SmallVector_00930a20;
          if (local_78._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_78,local_78._M_head_impl);
          }
        }
        uVar3 = (ulong)(index | 1);
        pOVar5 = (phi->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(phi->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                -0x5555555555555555;
        if (uVar7 < uVar3 || uVar7 - uVar3 == 0) {
LAB_005f24d4:
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&local_b8,pOVar5 + uVar3);
      }
      pOVar5 = (phi->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(phi->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
              -0x5555555555555555;
      uVar7 = (ulong)(index + 2);
    } while (index + 2 < (uint)uVar3);
  }
LAB_005f248d:
  IRContext::ForgetUses((this->super_Pass).context_,phi);
  Instruction::ReplaceOperands(phi,&local_b8);
  IRContext::AnalyzeUses((this->super_Pass).context_,phi);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_b8);
  return;
}

Assistant:

void MemPass::RemovePhiOperands(
    Instruction* phi, const std::unordered_set<BasicBlock*>& reachable_blocks) {
  std::vector<Operand> keep_operands;
  uint32_t type_id = 0;
  // The id of an undefined value we've generated.
  uint32_t undef_id = 0;

  // Traverse all the operands in |phi|. Build the new operand vector by adding
  // all the original operands from |phi| except the unwanted ones.
  for (uint32_t i = 0; i < phi->NumOperands();) {
    if (i < 2) {
      // The first two arguments are always preserved.
      keep_operands.push_back(phi->GetOperand(i));
      ++i;
      continue;
    }

    // The remaining Phi arguments come in pairs. Index 'i' contains the
    // variable id, index 'i + 1' is the originating block id.
    assert(i % 2 == 0 && i < phi->NumOperands() - 1 &&
           "malformed Phi arguments");

    BasicBlock* in_block = cfg()->block(phi->GetSingleWordOperand(i + 1));
    if (reachable_blocks.find(in_block) == reachable_blocks.end()) {
      // If the incoming block is unreachable, remove both operands as this
      // means that the |phi| has lost an incoming edge.
      i += 2;
      continue;
    }

    // In all other cases, the operand must be kept but may need to be changed.
    uint32_t arg_id = phi->GetSingleWordOperand(i);
    Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
    BasicBlock* def_block = context()->get_instr_block(arg_def_instr);
    if (def_block &&
        reachable_blocks.find(def_block) == reachable_blocks.end()) {
      // If the current |phi| argument was defined in an unreachable block, it
      // means that this |phi| argument is no longer defined. Replace it with
      // |undef_id|.
      if (!undef_id) {
        type_id = arg_def_instr->type_id();
        undef_id = Type2Undef(type_id);
      }
      keep_operands.push_back(
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {undef_id}));
    } else {
      // Otherwise, the argument comes from a reachable block or from no block
      // at all (meaning that it was defined in the global section of the
      // program).  In both cases, keep the argument intact.
      keep_operands.push_back(phi->GetOperand(i));
    }

    keep_operands.push_back(phi->GetOperand(i + 1));

    i += 2;
  }

  context()->ForgetUses(phi);
  phi->ReplaceOperands(keep_operands);
  context()->AnalyzeUses(phi);
}